

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

QString * anon_unknown.dwarf_9d8bc::expandEnum
                    (QString *__return_storage_ptr__,QString *value,QString *prefix)

{
  char cVar1;
  QString *pQVar2;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString_&> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QString::startsWith(value,(CaseSensitivity)prefix);
  if (cVar1 == '\0') {
    s.m_data = "::";
    s.m_size = 2;
    pQVar2 = (QString *)QString::lastIndexOf(value,s,CaseSensitive);
    if (pQVar2 == (QString *)0xffffffffffffffff) {
      local_48.a.b.m_size = 2;
      local_48.a.b.m_data = "::";
      local_48.a.a = prefix;
      local_48.b = value;
      QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString_&>::convertTo<QString>
                (__return_storage_ptr__,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return __return_storage_ptr__;
      }
      goto LAB_0012e52f;
    }
    QString::replace((longlong)value,0,pQVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&value->d);
    return __return_storage_ptr__;
  }
LAB_0012e52f:
  __stack_chk_fail();
}

Assistant:

QString expandEnum(QString value, const QString &prefix)
    {
        if (value.startsWith(prefix))
            return value;
        const auto pos = value.lastIndexOf("::"_L1);
        if (pos == -1)
            return prefix + "::"_L1 + value;
        value.replace(0, pos, prefix);
        return value;
    }